

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

event_item * raw_dequeue_event(CManager_conflict cm,queue_ptr q)

{
  _event_path_data *p_Var1;
  queue_item *pqVar2;
  event_item *event;
  queue_item *item;
  event_path_data evp;
  queue_ptr q_local;
  CManager_conflict cm_local;
  event_item *local_8;
  
  p_Var1 = cm->evp;
  pqVar2 = q->queue_head;
  if (pqVar2 == (queue_item *)0x0) {
    local_8 = (event_item *)0x0;
  }
  else {
    local_8 = pqVar2->item;
    if (q->queue_head == q->queue_tail) {
      q->queue_head = (queue_item *)0x0;
      q->queue_tail = (queue_item *)0x0;
    }
    else {
      q->queue_head = q->queue_head->next;
    }
    pqVar2->next = p_Var1->queue_items_free_list;
    p_Var1->queue_items_free_list = pqVar2;
  }
  return local_8;
}

Assistant:

static event_item *
raw_dequeue_event(CManager cm, queue_ptr q)
{
    event_path_data evp = cm->evp;
    queue_item *item = q->queue_head;
    event_item *event = NULL;
    if (item == NULL) return event;
    event = item->item;
    if (q->queue_head == q->queue_tail) {
	q->queue_head = NULL;
	q->queue_tail = NULL;
    } else {
	q->queue_head = q->queue_head->next;
    }   
    item->next = evp->queue_items_free_list;
    evp->queue_items_free_list = item;
    return event;
}